

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dropt.c
# Opt level: O0

_Bool is_valid_option(dropt_option *option)

{
  bool local_12;
  byte local_11;
  dropt_option *option_local;
  
  local_11 = 0;
  if (option != (dropt_option *)0x0) {
    local_12 = false;
    if ((((option->long_name == (dropt_char *)0x0) && (local_12 = false, option->short_name == '\0')
         ) && (local_12 = false, option->description == (dropt_char *)0x0)) &&
       (((local_12 = false, option->arg_description == (dropt_char *)0x0 &&
         (local_12 = false, option->handler == (dropt_option_handler_func)0x0)) &&
        ((local_12 = false, option->dest == (void *)0x0 && (local_12 = false, option->attr == 0)))))
       ) {
      local_12 = option->extra_data == 0;
    }
    local_11 = local_12 ^ 0xff;
  }
  return (_Bool)(local_11 & 1);
}

Assistant:

static bool
is_valid_option(const dropt_option* option)
{
    return    option != NULL
           && !(   option->long_name == NULL
                && option->short_name == DROPT_TEXT_LITERAL('\0')
                && option->description == NULL
                && option->arg_description == NULL
                && option->handler == NULL
                && option->dest == NULL
                && option->attr == 0
                && option->extra_data == 0);
}